

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

void __thiscall CVmObjTads::save_to_file(CVmObjTads *this,CVmFile *fp)

{
  char *pcVar1;
  char *pcVar2;
  uint16_t tmp;
  long lVar3;
  uint v;
  ulong uVar4;
  vm_val_t *val;
  bool bVar5;
  char slot [16];
  
  pcVar1 = (this->super_CVmObject).ext_;
  v = 0;
  for (lVar3 = 0; (ulong)*(ushort *)(pcVar1 + 0x22) * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
    v = v + (*(byte *)(*(long *)(pcVar1 + 0x18) + 0x10 + lVar3) & 1);
  }
  CVmFile::write_uint2(fp,v);
  CVmFile::write_uint2(fp,(uint)*(ushort *)((this->super_CVmObject).ext_ + 0x24));
  lVar3 = 0x28;
  for (uVar4 = 0; pcVar2 = (this->super_CVmObject).ext_, uVar4 < *(ushort *)(pcVar2 + 0x24);
      uVar4 = uVar4 + 1) {
    CVmFile::write_uint4(fp,*(uint *)(pcVar2 + lVar3));
    lVar3 = lVar3 + 0x10;
  }
  uVar4 = (ulong)*(ushort *)(pcVar1 + 0x22);
  val = (vm_val_t *)(*(long *)(pcVar1 + 0x18) + 0x18);
  while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
    if (((ulong)val[-1].val & 1) != 0) {
      slot._0_2_ = val[-2].val.prop;
      vmb_put_dh(slot + 2,val);
      CVmFile::write_bytes(fp,slot,7);
    }
    val = (vm_val_t *)&val[2].val;
  }
  return;
}

Assistant:

void CVmObjTads::save_to_file(VMG_ CVmFile *fp)
{
    size_t i;
    vm_tadsobj_prop *entry;
    uint cnt;
    vm_tadsobj_hdr *hdr = get_hdr();

    /* count the number of properties that have actually been modified */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, count it */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
            ++cnt;
    }

    /* write the number of modified properties */
    fp->write_uint2(cnt);

    /* write the number of superclasses */
    fp->write_uint2(get_sc_count());

    /* write the superclasses */
    for (i = 0 ; i < get_sc_count() ; ++i)
        fp->write_uint4(get_sc(i));

    /* write each modified property */
    for (cnt = 0, i = hdr->prop_entry_free, entry = hdr->prop_entry_arr ;
         i != 0 ; --i, ++entry)
    {
        /* if the slot is modified, write it out */
        if ((entry->flags & VMTO_PROP_MOD) != 0)
        {
            char slot[16];

            /* prepare the slot data */
            oswp2(slot, entry->prop);
            vmb_put_dh(slot + 2, &entry->val);

            /* write the slot */
            fp->write_bytes(slot, 2 + VMB_DATAHOLDER);
        }
    }
}